

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.h
# Opt level: O0

Vec3<float> Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand32>(Rand32 *rand)

{
  float fVar1;
  float *pfVar2;
  Vec3<float> *in_RDI;
  Vec3<float> VVar3;
  uint i;
  BaseType_conflict1 length;
  Vec3<float> v;
  float in_stack_ffffffffffffffb8;
  undefined3 uVar4;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float a;
  float local_24;
  Vec3<float> local_1c [2];
  
  Vec3<float>::Vec3(local_1c);
  do {
    local_24 = 0.0;
    while( true ) {
      a = local_24;
      fVar1 = (float)Vec3<float>::dimensions();
      if ((uint)fVar1 <= (uint)a) break;
      in_stack_ffffffffffffffc0 =
           Rand32::nextf((Rand32 *)CONCAT44(a,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
                         in_stack_ffffffffffffffb8);
      pfVar2 = Vec3<float>::operator[](local_1c,(int)local_24);
      *pfVar2 = in_stack_ffffffffffffffc0;
      local_24 = (float)((int)local_24 + 1);
    }
    fVar1 = Vec3<float>::length(in_RDI);
    uVar4 = SUB43(in_stack_ffffffffffffffbc,0);
    in_stack_ffffffffffffffbc = (float)CONCAT13(1,uVar4);
    if (fVar1 <= 1.0) {
      in_stack_ffffffffffffffbc = (float)CONCAT13(fVar1 == 0.0,uVar4);
    }
  } while ((char)((uint)in_stack_ffffffffffffffbc >> 0x18) != '\0');
  VVar3 = Vec3<float>::operator/(in_RDI,a);
  return VVar3;
}

Assistant:

Vec
hollowSphereRand (Rand &rand)
{
    Vec v;
    typename Vec::BaseType length;

    do
    {
	for (unsigned int i = 0; i < Vec::dimensions(); i++)
	    v[i] = (typename Vec::BaseType) rand.nextf (-1, 1);

	length = v.length();
    }
    while (length > 1 || length == 0);

    return v / length;
}